

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

void __thiscall soplex::SPxScaler<double>::unscale(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  Nonzero<double> *pNVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  int j;
  long lVar5;
  int i;
  long lVar6;
  Item *pIVar7;
  double dVar8;
  
  for (lVar6 = 0; lVar6 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar6 = lVar6 + 1) {
    pIVar7 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar6].idx;
    iVar3 = (lp->super_LPRowSetBase<double>).scaleExp.data[lVar6];
    lVar4 = 0;
    for (lVar5 = 0; lVar5 < (pIVar7->data).super_SVectorBase<double>.memused; lVar5 = lVar5 + 1) {
      pNVar1 = (pIVar7->data).super_SVectorBase<double>.m_elem;
      dVar8 = ldexp(*(double *)((long)&pNVar1->val + lVar4),
                    -((lp->super_LPColSetBase<double>).scaleExp.data
                      [*(int *)((long)&pNVar1->idx + lVar4)] + iVar3));
      *(double *)((long)&((pIVar7->data).super_SVectorBase<double>.m_elem)->val + lVar4) = dVar8;
      lVar4 = lVar4 + 0x10;
    }
    iVar3 = -iVar3;
    dVar8 = ldexp((lp->super_LPRowSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6],iVar3);
    (lp->super_LPRowSetBase<double>).object.val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar6] = dVar8;
    dVar8 = (lp->super_LPRowSetBase<double>).right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    pdVar2 = (double *)infinity();
    if (dVar8 < *pdVar2) {
      dVar8 = ldexp((lp->super_LPRowSetBase<double>).right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6],iVar3);
      (lp->super_LPRowSetBase<double>).right.val.super__Vector_base<double,_std::allocator<double>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar6] = dVar8;
    }
    dVar8 = (lp->super_LPRowSetBase<double>).left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    pdVar2 = (double *)infinity();
    if (-*pdVar2 < dVar8) {
      dVar8 = ldexp((lp->super_LPRowSetBase<double>).left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6],iVar3);
      (lp->super_LPRowSetBase<double>).left.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar6] = dVar8;
    }
  }
  for (lVar6 = 0; lVar6 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar6 = lVar6 + 1) {
    pIVar7 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar6].idx;
    iVar3 = (lp->super_LPColSetBase<double>).scaleExp.data[lVar6];
    lVar4 = 0;
    for (lVar5 = 0; lVar5 < (pIVar7->data).super_SVectorBase<double>.memused; lVar5 = lVar5 + 1) {
      pNVar1 = (pIVar7->data).super_SVectorBase<double>.m_elem;
      dVar8 = ldexp(*(double *)((long)&pNVar1->val + lVar4),
                    -((lp->super_LPRowSetBase<double>).scaleExp.data
                      [*(int *)((long)&pNVar1->idx + lVar4)] + iVar3));
      *(double *)((long)&((pIVar7->data).super_SVectorBase<double>.m_elem)->val + lVar4) = dVar8;
      lVar4 = lVar4 + 0x10;
    }
    dVar8 = ldexp((lp->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6],-iVar3);
    (lp->super_LPColSetBase<double>).object.val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[lVar6] = dVar8;
    dVar8 = (lp->super_LPColSetBase<double>).up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    pdVar2 = (double *)infinity();
    if (dVar8 < *pdVar2) {
      dVar8 = ldexp((lp->super_LPColSetBase<double>).up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6],iVar3);
      (lp->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar6] = dVar8;
    }
    dVar8 = (lp->super_LPColSetBase<double>).low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    pdVar2 = (double *)infinity();
    if (-*pdVar2 < dVar8) {
      dVar8 = ldexp((lp->super_LPColSetBase<double>).low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6],iVar3);
      (lp->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar6] = dVar8;
    }
  }
  lp->_isScaled = false;
  return;
}

Assistant:

void SPxScaler<R>::unscale(SPxLPBase<R>& lp)
{
   assert(lp.isScaled());

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      SVectorBase<R>& vec = lp.rowVector_w(i);

      int exp1;
      int exp2 = rowscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = colscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), -exp1 - exp2);
      }

      lp.maxRowObj_w(i) = spxLdexp(lp.maxRowObj(i), -exp2);

      if(lp.rhs(i) < R(infinity))
         lp.rhs_w(i) = spxLdexp(lp.rhs_w(i), -exp2);

      if(lp.lhs(i) > R(-infinity))
         lp.lhs_w(i) = spxLdexp(lp.lhs_w(i), -exp2);
   }

   for(int i = 0; i < lp.nCols(); ++i)
   {
      SVectorBase<R>& vec = lp.colVector_w(i);

      int exp1;
      int exp2 = colscaleExp[i];

      for(int j = 0; j < vec.size(); ++j)
      {
         exp1 = rowscaleExp[vec.index(j)];
         vec.value(j) = spxLdexp(vec.value(j), -exp1 - exp2);
      }

      lp.maxObj_w(i) = spxLdexp(lp.maxObj_w(i), -exp2);

      if(lp.upper(i) < R(infinity))
         lp.upper_w(i) = spxLdexp(lp.upper_w(i), exp2);

      if(lp.lower(i) > R(-infinity))
         lp.lower_w(i) = spxLdexp(lp.lower_w(i), exp2);
   }

   lp._isScaled = false;
   assert(lp.isConsistent());
}